

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O3

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_short>::RateAdaptiveCode<unsigned_int>
          (RateAdaptiveCode<unsigned_short> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *rowIdx)

{
  ushort uVar1;
  ushort *puVar2;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __result;
  ushort *puVar3;
  ushort *puVar4;
  ushort uVar5;
  bool bVar6;
  allocator_type local_21;
  
  puVar3 = (rowIdx->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (rowIdx->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = puVar3 + 1;
  if (puVar4 != puVar2 && puVar3 != puVar2) {
    uVar5 = *puVar3;
    do {
      uVar1 = *puVar4;
      bVar6 = uVar5 < uVar1;
      if (uVar5 <= uVar1) {
        uVar5 = uVar1;
      }
      if (bVar6) {
        puVar3 = puVar4;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
  }
  this->n_mother_rows = (ulong)*puVar3 + 1;
  this->n_cols = ((long)(colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) - 1;
  compute_mother_pos_varn<unsigned_int>(&this->mother_pos_varn,colptr,rowIdx);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&this->rows_to_combine,(initializer_list<unsigned_short>)ZEXT816(0),&local_21);
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_ra_rows = 0;
  recompute_pos_vn_cn(this,0);
  return;
}

Assistant:

RateAdaptiveCode(const std::vector<colptr_t> &colptr, const std::vector<idx_t> &rowIdx)
                : n_mother_rows(*std::max_element(rowIdx.begin(), rowIdx.end()) + 1u),
                  n_cols(colptr.size() - 1),
                  mother_pos_varn(compute_mother_pos_varn(colptr, rowIdx)), // computed here and henceforth `const`!
                  rows_to_combine({}) {
            constexpr idx_t n_line_combs = 0;
            recompute_pos_vn_cn(n_line_combs);
        }